

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall clask::server_t::parse_tree(server_t *this,node *n,string *s,func_t *fn)

{
  node *n_00;
  bool bVar1;
  __type _Var2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  string local_278;
  undefined1 auStack_258 [8];
  node nn_1;
  string local_1b0;
  node *local_190;
  _node *vv_1;
  iterator __end1;
  iterator __begin1;
  vector<clask::_node,_std::allocator<clask::_node>_> *__range1;
  string local_168 [7];
  bool found;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sub;
  undefined1 auStack_118 [8];
  node nn;
  _node *vv;
  iterator __end2;
  iterator __begin2;
  vector<clask::_node,_std::allocator<clask::_node>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sub_1;
  bool found_1;
  bool placeholder;
  size_type pos;
  func_t *fn_local;
  string *s_local;
  node *n_local;
  server_t *this_local;
  
  lVar4 = std::__cxx11::string::find((char)s,0x2f);
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)s);
  sub_1.field_2._M_local_buf[0xf] = *pcVar5 == ':';
  if (lVar4 == -1) {
    sub_1.field_2._M_local_buf[0xe] = '\0';
    std::__cxx11::string::substr((ulong)&__range2,(ulong)s);
    __end2 = std::vector<clask::_node,_std::allocator<clask::_node>_>::begin(&n->children);
    vv = (_node *)std::vector<clask::_node,_std::allocator<clask::_node>_>::end(&n->children);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>
                                       *)&vv), bVar1) {
      nn._152_8_ = __gnu_cxx::
                   __normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>
                   ::operator*(&__end2);
      _Var2 = std::operator==(&((reference)nn._152_8_)->name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__range2);
      if (_Var2) {
        sub_1.field_2._M_local_buf[0xe] = '\x01';
        break;
      }
      __gnu_cxx::
      __normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>::
      operator++(&__end2);
    }
    if ((sub_1.field_2._M_local_buf[0xe] & 1U) == 0) {
      auStack_118 = (undefined1  [8])0x0;
      nn.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      nn.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<clask::_node,_std::allocator<clask::_node>_>::vector
                ((vector<clask::_node,_std::allocator<clask::_node>_> *)auStack_118);
      std::__cxx11::string::string
                ((string *)
                 &nn.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&__range2);
      _func_t::_func_t((_func_t *)((long)&nn.name.field_2 + 8),fn);
      nn.fn.f_response._M_invoker._0_1_ = sub_1.field_2._M_local_buf[0xf] & 1;
      std::vector<clask::_node,std::allocator<clask::_node>>::emplace_back<clask::_node&>
                ((vector<clask::_node,std::allocator<clask::_node>> *)n,(_node *)auStack_118);
      _node::~_node((_node *)auStack_118);
    }
    std::__cxx11::string::~string((string *)&__range2);
  }
  else {
    std::__cxx11::string::substr((ulong)local_148,(ulong)s);
    if ((sub_1.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::substr((ulong)local_168,(ulong)local_148);
      std::__cxx11::string::operator=((string *)local_148,local_168);
      std::__cxx11::string::~string(local_168);
    }
    bVar1 = false;
    __end1 = std::vector<clask::_node,_std::allocator<clask::_node>_>::begin(&n->children);
    vv_1 = (_node *)std::vector<clask::_node,_std::allocator<clask::_node>_>::end(&n->children);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>
                                       *)&vv_1), bVar3) {
      local_190 = __gnu_cxx::
                  __normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>
                  ::operator*(&__end1);
      _Var2 = std::operator==(&local_190->name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_148);
      n_00 = local_190;
      if (_Var2) {
        bVar1 = true;
        std::__cxx11::string::substr((ulong)&local_1b0,(ulong)s);
        parse_tree(this,n_00,&local_1b0,fn);
        std::__cxx11::string::~string((string *)&local_1b0);
        break;
      }
      __gnu_cxx::
      __normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>::
      operator++(&__end1);
    }
    if (!bVar1) {
      auStack_258 = (undefined1  [8])0x0;
      nn_1.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      nn_1.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<clask::_node,_std::allocator<clask::_node>_>::vector
                ((vector<clask::_node,_std::allocator<clask::_node>_> *)auStack_258);
      std::__cxx11::string::string
                ((string *)
                 &nn_1.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_148);
      std::function<void_(clask::response_writer_&,_clask::request_&)>::function
                ((function<void_(clask::response_writer_&,_clask::request_&)> *)
                 ((long)&nn_1.name.field_2 + 8));
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
                  *)&nn_1.fn.f_writer._M_invoker);
      std::function<clask::response_(clask::request_&)>::function
                ((function<clask::response_(clask::request_&)> *)&nn_1.fn.f_string._M_invoker);
      nn_1.fn.f_response._M_invoker._0_1_ = sub_1.field_2._M_local_buf[0xf] & 1;
      std::__cxx11::string::substr((ulong)&local_278,(ulong)s);
      parse_tree(this,(node *)auStack_258,&local_278,fn);
      std::__cxx11::string::~string((string *)&local_278);
      std::vector<clask::_node,_std::allocator<clask::_node>_>::emplace_back<clask::_node>
                (&n->children,(_node *)auStack_258);
      _node::~_node((_node *)auStack_258);
    }
    std::__cxx11::string::~string((string *)local_148);
  }
  return;
}

Assistant:

inline void server_t::parse_tree(node& n, const std::string& s, const func_t& fn) {
  auto pos = s.find('/', 1);
  auto placeholder = s[1] == ':';
  if (pos == std::string::npos) {
    bool found = false;
    auto sub = s.substr(placeholder ? 2 : 1);
    for (auto& vv : n.children) {
      if (vv.name == sub) {
        found = true;
        break;
      }
    }
    if (!found) {
      node nn =  {
        .name = std::move(sub),
        .fn = fn,
        .placeholder = placeholder,
      };
      n.children.emplace_back(nn);
    }
    return;
  }
  auto sub = s.substr(1, pos - 1);
  if (placeholder) sub = sub.substr(1);
  bool found = false;
  for (auto& vv : n.children) {
    if (vv.name == sub) {
      found = true;
      parse_tree(vv, s.substr(pos), fn);
      break;
    }
  }
  if (!found) {
    node nn = {
      .name = std::move(sub),
      .placeholder = placeholder,
    };
    parse_tree(nn, s.substr(pos), fn);
    n.children.emplace_back(std::move(nn));
  }
}